

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.hpp
# Opt level: O1

void __thiscall
helics::PublicationInfo::PublicationInfo
          (PublicationInfo *this,GlobalHandle pid,string_view pkey,string_view ptype,
          string_view punits)

{
  SmallBuffer *pSVar1;
  
  this->id = pid;
  (this->subscribers).
  super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subscribers).
  super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subscribers).
  super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->key,pkey._M_str,pkey._M_str + pkey._M_len);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->type,ptype._M_str,ptype._M_str + ptype._M_len);
  (this->units)._M_dataplus._M_p = (pointer)&(this->units).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->units,punits._M_str,punits._M_str + punits._M_len);
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x30] = 0;
  (pSVar1->buffer)._M_elems[0x31] = 0;
  (pSVar1->buffer)._M_elems[0x32] = 0;
  (pSVar1->buffer)._M_elems[0x33] = 0;
  (pSVar1->buffer)._M_elems[0x34] = 0;
  (pSVar1->buffer)._M_elems[0x35] = 0;
  (pSVar1->buffer)._M_elems[0x36] = 0;
  (pSVar1->buffer)._M_elems[0x37] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x38] = 0;
  (pSVar1->buffer)._M_elems[0x39] = 0;
  (pSVar1->buffer)._M_elems[0x3a] = 0;
  (pSVar1->buffer)._M_elems[0x3b] = 0;
  (pSVar1->buffer)._M_elems[0x3c] = 0;
  (pSVar1->buffer)._M_elems[0x3d] = 0;
  (pSVar1->buffer)._M_elems[0x3e] = 0;
  (pSVar1->buffer)._M_elems[0x3f] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x20] = 0;
  (pSVar1->buffer)._M_elems[0x21] = 0;
  (pSVar1->buffer)._M_elems[0x22] = 0;
  (pSVar1->buffer)._M_elems[0x23] = 0;
  (pSVar1->buffer)._M_elems[0x24] = 0;
  (pSVar1->buffer)._M_elems[0x25] = 0;
  (pSVar1->buffer)._M_elems[0x26] = 0;
  (pSVar1->buffer)._M_elems[0x27] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x28] = 0;
  (pSVar1->buffer)._M_elems[0x29] = 0;
  (pSVar1->buffer)._M_elems[0x2a] = 0;
  (pSVar1->buffer)._M_elems[0x2b] = 0;
  (pSVar1->buffer)._M_elems[0x2c] = 0;
  (pSVar1->buffer)._M_elems[0x2d] = 0;
  (pSVar1->buffer)._M_elems[0x2e] = 0;
  (pSVar1->buffer)._M_elems[0x2f] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x10] = 0;
  (pSVar1->buffer)._M_elems[0x11] = 0;
  (pSVar1->buffer)._M_elems[0x12] = 0;
  (pSVar1->buffer)._M_elems[0x13] = 0;
  (pSVar1->buffer)._M_elems[0x14] = 0;
  (pSVar1->buffer)._M_elems[0x15] = 0;
  (pSVar1->buffer)._M_elems[0x16] = 0;
  (pSVar1->buffer)._M_elems[0x17] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x18] = 0;
  (pSVar1->buffer)._M_elems[0x19] = 0;
  (pSVar1->buffer)._M_elems[0x1a] = 0;
  (pSVar1->buffer)._M_elems[0x1b] = 0;
  (pSVar1->buffer)._M_elems[0x1c] = 0;
  (pSVar1->buffer)._M_elems[0x1d] = 0;
  (pSVar1->buffer)._M_elems[0x1e] = 0;
  (pSVar1->buffer)._M_elems[0x1f] = 0;
  (this->data).buffer._M_elems[0] = 0;
  (this->data).buffer._M_elems[1] = 0;
  (this->data).buffer._M_elems[2] = 0;
  (this->data).buffer._M_elems[3] = 0;
  (this->data).buffer._M_elems[4] = 0;
  (this->data).buffer._M_elems[5] = 0;
  (this->data).buffer._M_elems[6] = 0;
  (this->data).buffer._M_elems[7] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[8] = 0;
  (pSVar1->buffer)._M_elems[9] = 0;
  (pSVar1->buffer)._M_elems[10] = 0;
  (pSVar1->buffer)._M_elems[0xb] = 0;
  (pSVar1->buffer)._M_elems[0xc] = 0;
  (pSVar1->buffer)._M_elems[0xd] = 0;
  (pSVar1->buffer)._M_elems[0xe] = 0;
  (pSVar1->buffer)._M_elems[0xf] = 0;
  (this->data).bufferSize = 0;
  (this->data).bufferCapacity = 0x40;
  (this->data).heap = (byte *)&this->data;
  (this->data).nonOwning = false;
  (this->data).locked = false;
  (this->data).usingAllocatedBuffer = false;
  (this->data).errorCondition = '\0';
  (this->data).userKey = 0;
  (this->lastPublishTime).internalTimeCode = 0;
  this->has_update = false;
  this->only_update_on_change = false;
  this->required = false;
  this->buffer_data = false;
  this->requiredConnections = 0;
  (this->minTimeGap).internalTimeCode = 0;
  (this->destTargets)._M_dataplus._M_p = (pointer)&(this->destTargets).field_2;
  (this->destTargets)._M_string_length = 0;
  (this->destTargets).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PublicationInfo(GlobalHandle pid,
                    std::string_view pkey,
                    std::string_view ptype,
                    std::string_view punits): id(pid), key(pkey), type(ptype), units(punits)
    {
    }